

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_AddTxInOut_Test::TestBody(TransactionContext_AddTxInOut_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_610;
  AssertionResult gtest_ar__3;
  uint32_t index;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  AssertHelper local_598;
  OutPoint outpoint;
  TransactionContext txc;
  Address out1_addr;
  Script locking_script;
  Address script_addr;
  Address addr;
  
  cfd::TransactionContext::TransactionContext(&txc,2,0);
  std::__cxx11::string::string
            ((string *)&script_addr,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",(allocator *)&out1_addr);
  cfd::core::Address::Address(&addr,(string *)&script_addr);
  std::__cxx11::string::~string((string *)&script_addr);
  std::__cxx11::string::string
            ((string *)&script_addr,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (allocator *)&out1_addr);
  cfd::core::Script::Script(&locking_script,(string *)&script_addr);
  std::__cxx11::string::~string((string *)&script_addr);
  cfd::core::Address::Address(&script_addr,kCfdSuccess,&locking_script);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&indexes);
  cfd::core::Txid::Txid((Txid *)&out1_addr,(string *)&gtest_ar);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&out1_addr,2);
  cfd::core::Txid::~Txid((Txid *)&out1_addr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&indexes,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&gtest_ar__3);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&indexes);
  cfd::core::OutPoint::OutPoint((OutPoint *)&out1_addr,(Txid *)&gtest_ar,0);
  cfd::TransactionContext::AddTxIn(&txc,(OutPoint *)&out1_addr);
  cfd::core::Txid::~Txid((Txid *)&out1_addr);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&indexes);
  cfd::TransactionContext::AddTxIn(&txc,&outpoint);
  cfd::core::Amount::Amount((Amount *)&out1_addr,100000000000000);
  cfd::TransactionContext::AddTxOut(&txc,&script_addr,(Amount *)&out1_addr);
  cfd::core::Amount::Amount((Amount *)&out1_addr,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut(&txc,&addr,(Amount *)&out1_addr);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&out1_addr,(AbstractTransaction *)&txc);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000\""
             ,(char *)out1_addr._0_8_,
             "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000"
            );
  std::__cxx11::string::~string((string *)&out1_addr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&out1_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&out1_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out1_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&out1_addr,&addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",(char *)out1_addr._0_8_,
             "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  std::__cxx11::string::~string((string *)&out1_addr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&out1_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&out1_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out1_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::TransactionContext::GetTxOutAddress(&out1_addr,&txc,1,kMainnet);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar,&out1_addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&indexes,"out1_addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  index = 0;
  bVar1 = cfd::TransactionContext::IsFindTxIn(&txc,&outpoint,&index);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&indexes,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x60,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"index","1",&index,(int *)&indexes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::TransactionContext::IsFindTxOut
                    (&txc,&addr,&index,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&indexes,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x62,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"index","1",&index,(int *)&indexes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&script_addr);
  bVar1 = cfd::TransactionContext::IsFindTxOut
                    (&txc,(Script *)&gtest_ar,&index,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if ((char)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&indexes,
               (AssertionResult *)"txc.IsFindTxOut(script_addr.GetLockingScript(), &index)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,100,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"index","0",&index,(int *)&indexes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar2 = cfd::TransactionContext::GetTxOutIndex(&txc,&addr);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
  gtest_ar__3._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txc.GetTxOutIndex(addr)","1",(uint *)&indexes,
             (int *)&gtest_ar__3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,100000000000000);
  cfd::TransactionContext::AddTxOut(&txc,&script_addr,(Amount *)&gtest_ar);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut(&txc,&addr,(Amount *)&gtest_ar);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,100000000000000);
  cfd::TransactionContext::AddTxOut(&txc,&script_addr,(Amount *)&gtest_ar);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cfd::TransactionContext::IsFindTxOut(&txc,&script_addr,&index,&indexes);
  gtest_ar__3.success_ = bVar1;
  gtest_ar__3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__3,
               (AssertionResult *)"txc.IsFindTxOut(script_addr, &index, &indexes)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_610);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__3.message_);
  gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"index","0",&index,(int *)&gtest_ar__3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar__3._0_8_ =
       (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  local_610.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"indexes.size()","3",(unsigned_long *)&gtest_ar__3,
             (int *)&local_610);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__3);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0xc) {
    gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"indexes[0]","0",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)&gtest_ar__3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x70,pcVar3);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__3._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"indexes[1]","2",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1,(int *)&gtest_ar__3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x71,pcVar3);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__3._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar,"indexes[2]","4",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 2,(int *)&gtest_ar__3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_610,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x72,pcVar3);
      testing::internal::AssertHelper::operator=(&local_610,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_610);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__3);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::Address::~Address(&out1_addr);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  cfd::core::Address::~Address(&script_addr);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::Address::~Address(&addr);
  cfd::TransactionContext::~TransactionContext(&txc);
  return;
}

Assistant:

TEST(TransactionContext, AddTxInOut)
{
  TransactionContext txc(2, 0);
  Address addr("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  Script locking_script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  Address script_addr(NetType::kMainnet, locking_script);
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));

  EXPECT_STREQ(txc.GetHex().c_str(), "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kMainnet);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(script_addr.GetLockingScript(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);

  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(script_addr, &index, &indexes));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(indexes.size(), 3);
  if (indexes.size() == 3) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 2);
    EXPECT_EQ(indexes[2], 4);
  }
}